

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_paddush_mips64el(uint64_t fs,uint64_t ft)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar2._8_4_ = 0;
  auVar2._0_8_ = fs;
  auVar2._12_2_ = (short)(fs >> 0x30);
  auVar4._8_2_ = (short)(fs >> 0x20);
  auVar4._0_8_ = fs;
  auVar4._10_4_ = auVar2._10_4_;
  auVar6._6_8_ = 0;
  auVar6._0_6_ = auVar4._8_6_;
  auVar1._8_4_ = 0;
  auVar1._0_8_ = ft;
  auVar1._12_2_ = (short)(ft >> 0x30);
  auVar3._8_2_ = (short)(ft >> 0x20);
  auVar3._0_8_ = ft;
  auVar3._10_4_ = auVar1._10_4_;
  auVar7._6_8_ = 0;
  auVar7._0_6_ = auVar3._8_6_;
  auVar5._4_2_ = (short)(ft >> 0x10);
  auVar5._0_4_ = (uint)ft;
  auVar5._6_8_ = SUB148(auVar7 << 0x40,6);
  auVar10._0_4_ = ((uint)ft & 0xffff) + (uint)(ushort)fs;
  auVar10._4_4_ = auVar5._4_4_ + (int)CONCAT82(SUB148(auVar6 << 0x40,6),(short)(fs >> 0x10));
  auVar10._8_4_ = auVar3._8_4_ + auVar4._8_4_;
  auVar10._12_4_ = (auVar1._10_4_ >> 0x10) + (auVar2._10_4_ >> 0x10);
  auVar8._0_4_ = -(uint)(0xfffe < auVar10._0_4_);
  auVar8._4_4_ = -(uint)(0xfffe < auVar10._4_4_);
  auVar8._8_4_ = -(uint)(0xfffe < auVar10._8_4_);
  auVar8._12_4_ = -(uint)(0xfffe < auVar10._12_4_);
  auVar9._0_4_ = -(uint)(auVar10._0_4_ < 0xffff);
  auVar9._4_4_ = -(uint)(auVar10._4_4_ < 0xffff);
  auVar9._8_4_ = -(uint)(auVar10._8_4_ < 0xffff);
  auVar9._12_4_ = -(uint)(auVar10._12_4_ < 0xffff);
  auVar11._8_4_ = 0xffffffff;
  auVar11._0_8_ = 0xffffffffffffffff;
  auVar11._12_4_ = 0xffffffff;
  auVar8 = pshuflw(~auVar8 & auVar10,auVar11 ^ auVar9 | ~auVar8 & auVar10,0xe8);
  auVar8 = pshufhw(auVar8,auVar8,0xe8);
  return CONCAT44(auVar8._8_4_,auVar8._0_4_);
}

Assistant:

uint64_t helper_paddush(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        int r = vs.uh[i] + vt.uh[i];
        vs.uh[i] = SATUH(r);
    }
    return vs.d;
}